

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

hugeint_t __thiscall
duckdb::NegateOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
          (NegateOperator *this,hugeint_t input)

{
  bool bVar1;
  OutOfRangeException *this_00;
  hugeint_t hVar2;
  allocator local_49;
  string local_38;
  
  hVar2.upper = input.lower;
  hVar2.lower = (uint64_t)this;
  bVar1 = CanNegate<duckdb::hugeint_t>(hVar2);
  if (bVar1) {
    hVar2 = hugeint_t::operator-((hugeint_t *)&stack0xffffffffffffffb8);
    return hVar2;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Overflow in negation of integer!",&local_49);
  OutOfRangeException::OutOfRangeException(this_00,&local_38);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		auto cast = (TR)input;
		if (!CanNegate<TR>(cast)) {
			throw OutOfRangeException("Overflow in negation of integer!");
		}
		return -cast;
	}